

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Json1Init(sqlite3 *db)

{
  uint local_18;
  int local_14;
  uint i;
  int rc;
  sqlite3 *db_local;
  
  local_14 = 0;
  for (local_18 = 0; local_18 < 0xf && local_14 == 0; local_18 = local_18 + 1) {
    local_14 = sqlite3_create_function
                         (db,sqlite3Json1Init::aFunc[local_18].zName,
                          sqlite3Json1Init::aFunc[local_18].nArg,0x801,
                          &sqlite3Json1Init::aFunc[local_18].flag,
                          sqlite3Json1Init::aFunc[local_18].xFunc,
                          (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                          (_func_void_sqlite3_context_ptr *)0x0);
  }
  for (local_18 = 0; local_18 < 2 && local_14 == 0; local_18 = local_18 + 1) {
    local_14 = sqlite3_create_window_function
                         (db,sqlite3Json1Init::aAgg[local_18].zName,
                          sqlite3Json1Init::aAgg[local_18].nArg,0x801,(void *)0x0,
                          sqlite3Json1Init::aAgg[local_18].xStep,
                          sqlite3Json1Init::aAgg[local_18].xFinal,
                          sqlite3Json1Init::aAgg[local_18].xValue,jsonGroupInverse,
                          (_func_void_void_ptr *)0x0);
  }
  for (local_18 = 0; local_18 < 2 && local_14 == 0; local_18 = local_18 + 1) {
    local_14 = sqlite3_create_module
                         (db,sqlite3Json1Init::aMod[local_18].zName,
                          sqlite3Json1Init::aMod[local_18].pModule,(void *)0x0);
  }
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3Json1Init(sqlite3 *db){
  int rc = SQLITE_OK;
  unsigned int i;
  static const struct {
     const char *zName;
     int nArg;
     int flag;
     void (*xFunc)(sqlite3_context*,int,sqlite3_value**);
  } aFunc[] = {
    { "json",                 1, 0,   jsonRemoveFunc        },
    { "json_array",          -1, 0,   jsonArrayFunc         },
    { "json_array_length",    1, 0,   jsonArrayLengthFunc   },
    { "json_array_length",    2, 0,   jsonArrayLengthFunc   },
    { "json_extract",        -1, 0,   jsonExtractFunc       },
    { "json_insert",         -1, 0,   jsonSetFunc           },
    { "json_object",         -1, 0,   jsonObjectFunc        },
    { "json_patch",           2, 0,   jsonPatchFunc         },
    { "json_quote",           1, 0,   jsonQuoteFunc         },
    { "json_remove",         -1, 0,   jsonRemoveFunc        },
    { "json_replace",        -1, 0,   jsonReplaceFunc       },
    { "json_set",            -1, 1,   jsonSetFunc           },
    { "json_type",            1, 0,   jsonTypeFunc          },
    { "json_type",            2, 0,   jsonTypeFunc          },
    { "json_valid",           1, 0,   jsonValidFunc         },

#if SQLITE_DEBUG
    /* DEBUG and TESTING functions */
    { "json_parse",           1, 0,   jsonParseFunc         },
    { "json_test1",           1, 0,   jsonTest1Func         },
#endif
  };
  static const struct {
     const char *zName;
     int nArg;
     void (*xStep)(sqlite3_context*,int,sqlite3_value**);
     void (*xFinal)(sqlite3_context*);
     void (*xValue)(sqlite3_context*);
  } aAgg[] = {
    { "json_group_array",     1,
      jsonArrayStep,   jsonArrayFinal,  jsonArrayValue  },
    { "json_group_object",    2,
      jsonObjectStep,  jsonObjectFinal, jsonObjectValue },
  };
#ifndef SQLITE_OMIT_VIRTUALTABLE
  static const struct {
     const char *zName;
     sqlite3_module *pModule;
  } aMod[] = {
    { "json_each",            &jsonEachModule               },
    { "json_tree",            &jsonTreeModule               },
  };
#endif
  for(i=0; i<sizeof(aFunc)/sizeof(aFunc[0]) && rc==SQLITE_OK; i++){
    rc = sqlite3_create_function(db, aFunc[i].zName, aFunc[i].nArg,
                                 SQLITE_UTF8 | SQLITE_DETERMINISTIC, 
                                 (void*)&aFunc[i].flag,
                                 aFunc[i].xFunc, 0, 0);
  }
#ifndef SQLITE_OMIT_WINDOWFUNC
  for(i=0; i<sizeof(aAgg)/sizeof(aAgg[0]) && rc==SQLITE_OK; i++){
    rc = sqlite3_create_window_function(db, aAgg[i].zName, aAgg[i].nArg,
                                 SQLITE_UTF8 | SQLITE_DETERMINISTIC, 0,
                                 aAgg[i].xStep, aAgg[i].xFinal,
                                 aAgg[i].xValue, jsonGroupInverse, 0);
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  for(i=0; i<sizeof(aMod)/sizeof(aMod[0]) && rc==SQLITE_OK; i++){
    rc = sqlite3_create_module(db, aMod[i].zName, aMod[i].pModule, 0);
  }
#endif
  return rc;
}